

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>::
insert<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,capnp::StructSchema::Field&>
          (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                 table,size_t pos,Field *params)

{
  size_t *psVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  uint uVar4;
  uint uVar5;
  CapTableReader *pCVar6;
  HashBucket *pHVar7;
  Entry *this_00;
  ulong targetSize;
  long *in_R9;
  HashBucket *pHVar8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  ArrayPtr<const_unsigned_char> s;
  int local_38;
  undefined4 local_34;
  
  this_00 = table.ptr;
  uVar9 = (long)(this_00->key).proto._reader.capTable * 2;
  if (uVar9 < (*(size_t *)&(this_00->key).index + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar9) {
      targetSize = uVar9;
    }
    HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>::
    rehash((HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>
            *)this_00,targetSize);
  }
  local_38 = (int)((ulong)*in_R9 >> 0x20) * 0xbfe3 + (int)*in_R9;
  local_34 = (undefined4)in_R9[1];
  s.size_ = 8;
  s.ptr = (uchar *)&local_38;
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  uVar5 = kj::_::chooseBucket((uint)(uVar4 != 0),*(uint *)&(this_00->key).proto._reader.capTable);
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          (this_00->key).proto._reader.segment;
  pHVar7 = (HashBucket *)0x0;
  do {
    pHVar8 = (HashBucket *)(aVar3.value + (ulong)uVar5 * 8);
    uVar2 = pHVar8->value;
    if (uVar2 == 1) {
      if (pHVar7 == (HashBucket *)0x0) {
        pHVar7 = pHVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar7 != (HashBucket *)0x0) {
          psVar1 = (size_t *)&(this_00->key).index;
          *psVar1 = *psVar1 - 1;
          pHVar8 = pHVar7;
        }
        *pHVar8 = (HashBucket)(((ulong)(uVar4 != 0) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                 )0x0;
        goto LAB_00390304;
      }
      if (((pHVar8->hash == (uint)(uVar4 != 0)) &&
          (uVar9 = (ulong)(uVar2 - 2), *(long *)(table.size_ + uVar9 * 0x48) == *in_R9)) &&
         (*(int *)(table.size_ + 8 + uVar9 * 0x48) == (int)in_R9[1])) {
        *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = uVar9;
LAB_00390304:
        MVar10.ptr.field_1.value = aVar3.value;
        MVar10.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar10.ptr;
      }
    }
    pCVar6 = (CapTableReader *)((ulong)uVar5 + 1);
    uVar5 = (uint)pCVar6;
    if (pCVar6 == (this_00->key).proto._reader.capTable) {
      uVar5 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }